

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  Extension *pEVar1;
  Nonnull<const_char_*> failure_msg;
  anon_enum_32 local_24;
  LogMessageFatal local_20;
  
  pEVar1 = FindOrNull(this,number);
  if ((pEVar1 != (Extension *)0x0) && ((pEVar1->field_0xa & 2) == 0)) {
    local_20.super_LogMessage.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
    local_24 = OPTIONAL_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_20,&local_24,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_20.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
      local_24 = 8;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_20,&local_24,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        return (pEVar1->field_0).int32_t_value;
      }
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x1dd,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  return default_value;
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}